

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackRPMGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackRPMGenerator *this,string *componentName)

{
  bool bVar1;
  string *psVar2;
  cmValue local_b0;
  string *local_a8;
  cmValue local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string groupVar;
  allocator<char> local_21;
  string *local_20;
  string *componentName_local;
  cmCPackRPMGenerator *this_local;
  
  local_20 = componentName;
  componentName_local = (string *)this;
  this_local = (cmCPackRPMGenerator *)__return_storage_ptr__;
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ALL_COMPONENTS_IN_ONE",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_98,componentName);
    std::operator+(&local_78,"CPACK_COMPONENT_",&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_78,"_GROUP");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    cmValue::cmValue(&local_a0,(nullptr_t)0x0);
    local_a8 = (string *)
               cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_58);
    bVar1 = ::operator!=(local_a0,(cmValue)local_a8);
    if (bVar1) {
      local_b0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_58);
      psVar2 = cmValue::operator_cast_to_string_(&local_b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackRPMGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  if (this->componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    return componentName;
  }

  if (this->componentPackageMethod == ONE_PACKAGE) {
    return { "ALL_COMPONENTS_IN_ONE" };
  }
  // We have to find the name of the COMPONENT GROUP
  // the current COMPONENT belongs to.
  std::string groupVar =
    "CPACK_COMPONENT_" + cmSystemTools::UpperCase(componentName) + "_GROUP";
  if (nullptr != this->GetOption(groupVar)) {
    return std::string(this->GetOption(groupVar));
  }
  return componentName;
}